

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O2

int Abc_NtkMfsNode(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  Vec_Ptr_t *pVVar8;
  abctime aVar9;
  Aig_Man_t *pAVar10;
  Cnf_Dat_t *pCVar11;
  sat_solver *psVar12;
  Hop_Obj_t *pObj;
  float dProb;
  
  p->nNodesTried = p->nNodesTried + 1;
  Mfs_ManClean(p);
  aVar7 = Abc_Clock();
  pVVar8 = Abc_MfsComputeRoots(pNode,p->pPars->nWinTfoLevs,p->pPars->nFanoutsMax);
  p->vRoots = pVVar8;
  pVVar8 = Abc_NtkNodeSupport(p->pNtk,(Abc_Obj_t **)pVVar8->pArray,pVVar8->nSize);
  p->vSupp = pVVar8;
  pVVar8 = Abc_NtkDfsNodes(p->pNtk,(Abc_Obj_t **)p->vRoots->pArray,p->vRoots->nSize);
  p->vNodes = pVVar8;
  aVar9 = Abc_Clock();
  p->timeWin = p->timeWin + (aVar9 - aVar7);
  aVar7 = Abc_Clock();
  pAVar10 = Abc_NtkConstructAig(p,pNode);
  p->pAigWin = pAVar10;
  aVar9 = Abc_Clock();
  p->timeAig = p->timeAig + (aVar9 - aVar7);
  aVar7 = Abc_Clock();
  pCVar11 = Cnf_DeriveSimple(p->pAigWin,(pNode->vFanins).nSize);
  p->pCnf = pCVar11;
  aVar9 = Abc_Clock();
  p->timeCnf = p->timeCnf + (aVar9 - aVar7);
  aVar7 = Abc_Clock();
  psVar12 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,1,0);
  p->pSat = psVar12;
  iVar5 = 0;
  if ((psVar12 != (sat_solver *)0x0) &&
     ((p->pPars->fOneHotness == 0 || (Abc_NtkAddOneHotness(p), p->pSat != (sat_solver *)0x0)))) {
    iVar5 = Abc_NtkMfsSolveSat(p,pNode);
    p->nTotConfLevel = p->nTotConfLevel + (int)(p->pSat->stats).conflicts;
    aVar9 = Abc_Clock();
    p->timeSat = p->timeSat + (aVar9 - aVar7);
    if (iVar5 == 0) {
      uVar1 = p->nTimeOuts;
      uVar3 = p->nTimeOutsLevel;
      p->nTimeOuts = uVar1 + 1;
      p->nTimeOutsLevel = uVar3 + 1;
      iVar5 = 0;
    }
    else {
      if (p->nFanins != (pNode->vFanins).nSize) {
        __assert_fail("p->nFanins == Abc_ObjFaninNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsCore.c"
                      ,0x160,"int Abc_NtkMfsNode(Mfs_Man_t *, Abc_Obj_t *)");
      }
      if (p->pPars->fPower == 0) {
        dProb = -1.0;
      }
      else {
        dProb = (float)p->vProbs->pArray[pNode->Id];
      }
      pObj = Abc_NodeIfNodeResyn(p->pManDec,(Hop_Man_t *)pNode->pNtk->pManFunc,
                                 (Hop_Obj_t *)(pNode->field_5).pData,p->nFanins,p->vTruth,p->uCare,
                                 dProb);
      iVar6 = Hop_DagSize((Hop_Obj_t *)(pNode->field_5).pData);
      iVar5 = Hop_DagSize(pObj);
      iVar6 = iVar6 - iVar5;
      iVar5 = 1;
      if (-1 < iVar6) {
        uVar2 = p->nNodesDec;
        uVar4 = p->nNodesGained;
        p->nNodesDec = uVar2 + 1;
        p->nNodesGained = iVar6 + uVar4;
        p->nNodesGainedLevel = p->nNodesGainedLevel + iVar6;
        (pNode->field_5).pData = pObj;
      }
    }
  }
  return iVar5;
}

Assistant:

int Abc_NtkMfsNode( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Hop_Obj_t * pObj;
    int RetValue;
    float dProb;
    extern Hop_Obj_t * Abc_NodeIfNodeResyn( Bdc_Man_t * p, Hop_Man_t * pHop, Hop_Obj_t * pRoot, int nVars, Vec_Int_t * vTruth, unsigned * puCare, float dProb );

    int nGain;
    abctime clk;
    p->nNodesTried++;
    // prepare data structure for this node
    Mfs_ManClean( p );
    // compute window roots, window support, and window nodes
clk = Abc_Clock();
    p->vRoots = Abc_MfsComputeRoots( pNode, p->pPars->nWinTfoLevs, p->pPars->nFanoutsMax );
    p->vSupp  = Abc_NtkNodeSupport( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    p->vNodes = Abc_NtkDfsNodes( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
p->timeWin += Abc_Clock() - clk;
    // count the number of patterns
//    p->dTotalRatios += Abc_NtkConstraintRatio( p, pNode );
    // construct AIG for the window
clk = Abc_Clock();
    p->pAigWin = Abc_NtkConstructAig( p, pNode );
p->timeAig += Abc_Clock() - clk;
    // translate it into CNF
clk = Abc_Clock();
    p->pCnf = Cnf_DeriveSimple( p->pAigWin, Abc_ObjFaninNum(pNode) );
p->timeCnf += Abc_Clock() - clk;
    // create the SAT problem
clk = Abc_Clock();
    p->pSat = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, 1, 0 );
    if ( p->pSat && p->pPars->fOneHotness )
        Abc_NtkAddOneHotness( p );
    if ( p->pSat == NULL )
        return 0;
    // solve the SAT problem
    RetValue = Abc_NtkMfsSolveSat( p, pNode );
    p->nTotConfLevel += p->pSat->stats.conflicts;
p->timeSat += Abc_Clock() - clk;
    if ( RetValue == 0 )
    {
        p->nTimeOutsLevel++;
        p->nTimeOuts++;
        return 0;
    }
    // minimize the local function of the node using bi-decomposition
    assert( p->nFanins == Abc_ObjFaninNum(pNode) );
    dProb = p->pPars->fPower? ((float *)p->vProbs->pArray)[pNode->Id] : -1.0;
    pObj = Abc_NodeIfNodeResyn( p->pManDec, (Hop_Man_t *)pNode->pNtk->pManFunc, (Hop_Obj_t *)pNode->pData, p->nFanins, p->vTruth, p->uCare, dProb );
    nGain = Hop_DagSize((Hop_Obj_t *)pNode->pData) - Hop_DagSize(pObj);
    if ( nGain >= 0 )
    {
        p->nNodesDec++;
        p->nNodesGained += nGain;
        p->nNodesGainedLevel += nGain;
        pNode->pData = pObj;
    }
    return 1;
}